

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

Type ON_ModelComponent::ComponentTypeFromUnsigned(uint component_type_as_unsigned)

{
  Type local_9;
  uint component_type_as_unsigned_local;
  
  if (component_type_as_unsigned == 0) {
    local_9 = Unset;
  }
  else if (component_type_as_unsigned == 1) {
    local_9 = Image;
  }
  else if (component_type_as_unsigned == 2) {
    local_9 = TextureMapping;
  }
  else if (component_type_as_unsigned == 3) {
    local_9 = Material;
  }
  else if (component_type_as_unsigned == 4) {
    local_9 = LinePattern;
  }
  else if (component_type_as_unsigned == 5) {
    local_9 = Layer;
  }
  else if (component_type_as_unsigned == 6) {
    local_9 = Group;
  }
  else if (component_type_as_unsigned == 7) {
    local_9 = TextStyle;
  }
  else if (component_type_as_unsigned == 8) {
    local_9 = DimStyle;
  }
  else if (component_type_as_unsigned == 9) {
    local_9 = RenderLight;
  }
  else if (component_type_as_unsigned == 10) {
    local_9 = HatchPattern;
  }
  else if (component_type_as_unsigned == 0xb) {
    local_9 = InstanceDefinition;
  }
  else if (component_type_as_unsigned == 0xc) {
    local_9 = ModelGeometry;
  }
  else if (component_type_as_unsigned == 0xd) {
    local_9 = HistoryRecord;
  }
  else if (component_type_as_unsigned == 0xe) {
    local_9 = RenderContent;
  }
  else if (component_type_as_unsigned == 0xf) {
    local_9 = EmbeddedFile;
  }
  else if (component_type_as_unsigned == 0x10) {
    local_9 = ObsoleteValue;
  }
  else if (component_type_as_unsigned == 0x11) {
    local_9 = SectionStyle;
  }
  else if (component_type_as_unsigned == 0xfe) {
    local_9 = Mixed;
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x155,"","component_type_as_unsigned has invalid value.");
    local_9 = Unset;
  }
  return local_9;
}

Assistant:

ON_ModelComponent::Type ON_ModelComponent::ComponentTypeFromUnsigned(
  unsigned int component_type_as_unsigned
  )
{
  switch (component_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Image);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::TextureMapping);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Material);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::LinePattern);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Layer);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Group);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::TextStyle);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::DimStyle);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::RenderLight);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::HatchPattern);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::InstanceDefinition);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::ModelGeometry);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::HistoryRecord);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::RenderContent);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::EmbeddedFile);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::ObsoleteValue);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::SectionStyle);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_ModelComponent::Type::Mixed);
  }

  ON_ERROR("component_type_as_unsigned has invalid value.");
  return ON_ModelComponent::Type::Unset;
}